

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall t_php_generator::generate_service_helpers(t_php_generator *this,t_service *tservice)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  ostream *poVar4;
  reference pptVar5;
  undefined4 extraout_var;
  char *pcVar6;
  int __oflag;
  ofstream_with_content_based_conditional_update *poVar7;
  allocator local_169;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string f_struct_definition_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string name;
  t_struct *ts;
  t_function **local_58;
  ofstream_with_content_based_conditional_update *local_40;
  ofstream_with_content_based_conditional_update *f_struct_definition;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_php_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)&f_struct_definition);
  local_40 = &this->f_service_;
  if ((this->classmap_ & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)local_40,"// HELPER FUNCTIONS AND STRUCTURES");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  local_58 = (t_function **)
             std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                       ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  f_struct_definition = (ofstream_with_content_based_conditional_update *)local_58;
  while( true ) {
    ts = (t_struct *)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&f_struct_definition,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&ts);
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&f_struct_definition);
    name.field_2._8_8_ = t_function::get_arglist(*pptVar5);
    iVar3 = (*(((t_struct *)name.field_2._8_8_)->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)local_88,(string *)CONCAT44(extraout_var,iVar3));
    uVar1 = name.field_2._8_8_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&f_struct_definition_name.field_2 + 8),
                   &(this->super_t_oop_generator).super_t_generator.service_name_,"_");
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&f_struct_definition_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    (**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)(f_struct_definition_name.field_2._M_local_buf + 8));
    if ((this->classmap_ & 1U) == 0) {
      std::operator+(&local_148,&this->package_dir_,
                     &(this->super_t_oop_generator).super_t_generator.service_name_);
      std::operator+(&local_128,&local_148,"_");
      std::operator+(&local_108,&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     &local_108,".php");
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      poVar7 = local_40;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,pcVar6,&local_169);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                (poVar7,(char *)local_168,__oflag);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      generate_service_header(this,tservice,(ostream *)local_40);
      std::__cxx11::string::~string((string *)local_e8);
    }
    poVar7 = local_40;
    generate_php_struct_definition
              (this,(ostream *)local_40,(t_struct *)name.field_2._8_8_,false,false);
    if ((this->classmap_ & 1U) == 0) {
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
                (local_40,(int)poVar7);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&f_struct_definition);
    generate_php_function_helpers(this,tservice,*pptVar5);
    (**(code **)(*(long *)name.field_2._8_8_ + 0x10))(name.field_2._8_8_,local_88);
    std::__cxx11::string::~string((string *)local_88);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)&f_struct_definition);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_php_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  ofstream_with_content_based_conditional_update& f_struct_definition = f_service_;
  if (classmap_) {
    f_struct_definition << "// HELPER FUNCTIONS AND STRUCTURES" << endl << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);

    if (!classmap_) {
      string f_struct_definition_name = package_dir_ + service_name_ + "_" + name + ".php";
      f_struct_definition.open(f_struct_definition_name.c_str());
      generate_service_header(tservice, f_struct_definition);
    }

    generate_php_struct_definition(f_struct_definition, ts);
    if (!classmap_) {
      f_struct_definition.close();
    }

    generate_php_function_helpers(tservice, *f_iter);
    ts->set_name(name);
  }
}